

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  long *__ptr;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  uint uVar7;
  _GLFWwindow *window;
  ulong uVar8;
  int iVar9;
  _GLFWlibrary *p_Var10;
  
  if (_glfw.initialized != 0) {
    p_Var10 = &_glfw;
    if (count == 0) {
      XDeleteProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON);
    }
    else {
      if (count < 1) {
        iVar9 = 0;
      }
      else {
        lVar5 = 0;
        iVar9 = 0;
        do {
          iVar9 = iVar9 + *(int *)((long)&images->height + lVar5) *
                          *(int *)((long)&images->width + lVar5) + 2;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uint)count << 4 != lVar5);
      }
      __ptr = (long *)calloc((long)iVar9,8);
      if (0 < count) {
        uVar4 = 0;
        plVar6 = __ptr;
        do {
          iVar1 = images[uVar4].width;
          *plVar6 = (long)iVar1;
          iVar2 = images[uVar4].height;
          plVar6[1] = (long)iVar2;
          plVar6 = plVar6 + 2;
          uVar7 = iVar2 * iVar1;
          if (0 < (int)uVar7) {
            puVar3 = images[uVar4].pixels;
            lVar5 = 0;
            uVar8 = 0;
            do {
              plVar6[uVar8] =
                   (ulong)puVar3[uVar8 * 4 + 3] << 0x18 |
                   (ulong)puVar3[uVar8 * 4 + 2] |
                   (ulong)((uint)puVar3[uVar8 * 4 + 1] << 8 | (uint)puVar3[uVar8 * 4] << 0x10);
              uVar8 = uVar8 + 1;
              lVar5 = lVar5 + -8;
            } while (uVar7 != uVar8);
            plVar6 = (long *)((long)plVar6 - lVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)count);
      }
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_ICON,6,0x20
                      ,0,__ptr,iVar9,p_Var10);
      free(__ptr);
    }
    XFlush(_glfw.x11.display);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowIcon(window, count, images);
}